

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O3

void __thiscall
sjtu::LRUCache<sjtu::trainType>::CacheNode::CacheNode
          (CacheNode *this,trainType *value_,locType *offset_,LRUCache<sjtu::trainType> *bel_)

{
  locType lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  undefined6 uVar6;
  value_type local_48;
  pair<sjtu::map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_>::iterator,_bool>
  local_38;
  
  memcpy(this,value_,0xa768);
  iVar2 = value_->saleDate[0].day;
  iVar3 = value_->saleDate[0].hour;
  iVar4 = value_->saleDate[0].minute;
  (this->value).saleDate[0].month = value_->saleDate[0].month;
  (this->value).saleDate[0].day = iVar2;
  (this->value).saleDate[0].hour = iVar3;
  (this->value).saleDate[0].minute = iVar4;
  iVar2 = value_->saleDate[1].day;
  iVar3 = value_->saleDate[1].hour;
  iVar4 = value_->saleDate[1].minute;
  (this->value).saleDate[1].month = value_->saleDate[1].month;
  (this->value).saleDate[1].day = iVar2;
  (this->value).saleDate[1].hour = iVar3;
  (this->value).saleDate[1].minute = iVar4;
  iVar2 = (value_->startTime).day;
  iVar3 = (value_->startTime).hour;
  iVar4 = (value_->startTime).minute;
  (this->value).startTime.month = (value_->startTime).month;
  (this->value).startTime.day = iVar2;
  (this->value).startTime.hour = iVar3;
  (this->value).startTime.minute = iVar4;
  bVar5 = value_->is_released;
  uVar6 = *(undefined6 *)&value_->field_0xa79a;
  lVar1 = value_->offset;
  (this->value).type = value_->type;
  (this->value).is_released = bVar5;
  *(undefined6 *)&(this->value).field_0xa79a = uVar6;
  (this->value).offset = lVar1;
  local_48.first = *offset_;
  this->offset = local_48.first;
  this->is_dirty_page = false;
  this->prec = (CacheNode *)0x0;
  this->succ = (CacheNode *)0x0;
  this->bel = bel_;
  local_48.second = this;
  map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_>::insert
            (&local_38,&bel_->table,&local_48);
  return;
}

Assistant:

CacheNode(const valueType &value_ , const locType &offset_ , LRUCache<valueType> *bel_) : value(value_) , offset(offset_) , bel(bel_) , is_dirty_page(false) , prec(nullptr) , succ(nullptr)
			{
				bel -> table.insert(std::make_pair(offset , this));
			}